

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void riscv_translate_init_riscv32(uc_struct_conflict12 *uc)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGTemp *pTVar2;
  long lVar3;
  
  tcg_ctx = uc->tcg_ctx;
  tcg_ctx->cpu_gpr[0] = (TCGv_i32)0x0;
  lVar3 = 0;
  while (lVar3 != 0x7c) {
    pTVar1 = tcg_global_mem_new_i32
                       (tcg_ctx,tcg_ctx->cpu_env,lVar3 + 4,
                        *(char **)((long)riscv_int_regnames_riscv32 + lVar3 * 2 + 8));
    *(TCGv_i32 *)((long)tcg_ctx->cpu_gpr + lVar3 * 2 + 8) = pTVar1;
    lVar3 = lVar3 + 4;
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 8) {
    pTVar2 = tcg_global_mem_new_internal_riscv32
                       (tcg_ctx,TCG_TYPE_I64,tcg_ctx->cpu_env,lVar3 + 0x80,
                        *(char **)((long)riscv_fpr_regnames_riscv32 + lVar3));
    *(long *)((long)tcg_ctx->cpu_fpr + lVar3) = (long)pTVar2 - (long)tcg_ctx;
  }
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x180,"pc");
  tcg_ctx->cpu_pc = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x184,"load_res");
  tcg_ctx->load_res = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx,tcg_ctx->cpu_env,0x188,"load_val");
  tcg_ctx->load_val = pTVar1;
  return;
}

Assistant:

void riscv_translate_init(struct uc_struct *uc)
{
    int i;
    TCGContext *tcg_ctx = uc->tcg_ctx;

    /* cpu_gpr[0] is a placeholder for the zero register. Do not use it. */
    /* Use the gen_set_gpr and gen_get_gpr helper functions when accessing */
    /* registers, unless you specifically block reads/writes to reg 0 */
    tcg_ctx->cpu_gpr[0] = NULL;

    for (i = 1; i < 32; i++) {
        tcg_ctx->cpu_gpr[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
            offsetof(CPURISCVState, gpr[i]), riscv_int_regnames[i]);
    }

    for (i = 0; i < 32; i++) {
        tcg_ctx->cpu_fpr[i] = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
            offsetof(CPURISCVState, fpr[i]), riscv_fpr_regnames[i]);
    }

    tcg_ctx->cpu_pc = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, pc), "pc");
    tcg_ctx->load_res = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, load_res),
                             "load_res");
    tcg_ctx->load_val = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, load_val),
                             "load_val");
}